

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O2

void __thiscall capnp::_::anon_unknown_0::TestCase47::run(TestCase47 *this)

{
  Builder builder_00;
  Reader reader;
  Builder builder_01;
  Reader reader_00;
  Builder root;
  Reader local_168;
  Reader local_130;
  MallocMessageBuilder builder;
  
  MallocMessageBuilder::MallocMessageBuilder(&builder,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            (&root,&builder.super_MessageBuilder,(StructSchema)0x662308);
  builder_00.builder.segment = root.builder.segment;
  builder_00.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_00.builder.capTable = root.builder.capTable;
  builder_00.builder.data = root.builder.data;
  builder_00.builder.pointers = root.builder.pointers;
  builder_00.builder.dataSize = root.builder.dataSize;
  builder_00.builder.pointerCount = root.builder.pointerCount;
  builder_00.builder._38_2_ = root.builder._38_2_;
  initDynamicTestMessage(builder_00);
  DynamicStruct::Builder::asReader(&local_130,&root);
  Schema::requireUsableAs<capnproto_test::capnp::test::TestAllTypes>((Schema *)&local_130);
  reader._reader.capTable = local_130.reader.capTable;
  reader._reader.segment = local_130.reader.segment;
  reader._reader.data = local_130.reader.data;
  reader._reader.pointers = local_130.reader.pointers;
  reader._reader.dataSize = local_130.reader.dataSize;
  reader._reader.pointerCount = local_130.reader.pointerCount;
  reader._reader._38_2_ = local_130.reader._38_2_;
  reader._reader.nestingLimit = local_130.reader.nestingLimit;
  reader._reader._44_4_ = local_130.reader._44_4_;
  checkTestMessage(reader);
  DynamicStruct::Builder::asReader(&local_168,&root);
  reader_00.reader.segment = local_168.reader.segment;
  reader_00.schema.super_Schema.raw = local_168.schema.super_Schema.raw;
  reader_00.reader.capTable = local_168.reader.capTable;
  reader_00.reader.data = local_168.reader.data;
  reader_00.reader.pointers = local_168.reader.pointers;
  reader_00.reader.dataSize = local_168.reader.dataSize;
  reader_00.reader.pointerCount = local_168.reader.pointerCount;
  reader_00.reader._38_2_ = local_168.reader._38_2_;
  reader_00.reader.nestingLimit = local_168.reader.nestingLimit;
  reader_00.reader._44_4_ = local_168.reader._44_4_;
  checkDynamicTestMessage(reader_00);
  builder_01.builder.segment = root.builder.segment;
  builder_01.schema = (StructSchema)(StructSchema)root.schema.super_Schema.raw;
  builder_01.builder.capTable = root.builder.capTable;
  builder_01.builder.data = root.builder.data;
  builder_01.builder.pointers = root.builder.pointers;
  builder_01.builder.dataSize = root.builder.dataSize;
  builder_01.builder.pointerCount = root.builder.pointerCount;
  builder_01.builder._38_2_ = root.builder._38_2_;
  checkDynamicTestMessage(builder_01);
  MallocMessageBuilder::~MallocMessageBuilder(&builder);
  return;
}

Assistant:

TEST(DynamicApi, Build) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestAllTypes>());

  initDynamicTestMessage(root);
  checkTestMessage(root.asReader().as<TestAllTypes>());

  checkDynamicTestMessage(root.asReader());
  checkDynamicTestMessage(root);
}